

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O0

_Rb_tree_node<tcmalloc::Span_*> * __thiscall
tcmalloc::FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_>::Alloc
          (FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *this)

{
  FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *this_local;
  
  if ((this->inited & 1U) == 0) {
    if ((this->construct & 1U) == 0) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/fixed_allocator.hpp"
                    ,0x18,
                    "T *tcmalloc::FixedAllocator<std::_Rb_tree_node<tcmalloc::Span *>>::Alloc() [T = std::_Rb_tree_node<tcmalloc::Span *>]"
                   );
    }
    Init(this);
  }
  if (this->freelist_ == (void *)0x0) {
    this_local = (FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *)AllocFromArea(this);
  }
  else {
    this_local = (FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *)AllocFromFreeList(this);
  }
  return (_Rb_tree_node<tcmalloc::Span_*> *)this_local;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }